

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QDockAreaLayoutInfo::indexOf
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QWidget *widget)

{
  QDockAreaLayoutItem *pQVar1;
  ulong uVar2;
  long *plVar3;
  Data *pDVar4;
  bool bVar5;
  QWidget *pQVar6;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = (this->item_list).d.size != 0;
  if (bVar9) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      pQVar1 = (this->item_list).d.ptr;
      bVar5 = false;
      if (*(long *)((long)&pQVar1->placeHolderItem + lVar8) == 0) {
        if (*(long *)((long)&pQVar1->subinfo + lVar8) == 0) {
          bVar5 = false;
          if ((((*(byte *)((long)&pQVar1->flags + lVar8) & 1) == 0) &&
              (plVar3 = *(long **)((long)&pQVar1->widgetItem + lVar8), plVar3 != (long *)0x0)) &&
             (pQVar6 = (QWidget *)(**(code **)(*plVar3 + 0x68))(), pQVar6 == widget)) {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (int *)0x0;
            (__return_storage_ptr__->d).size = 0;
            local_3c = (int)uVar7;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                       &local_3c);
            QList<int>::end(__return_storage_ptr__);
            bVar5 = true;
          }
        }
        else {
          (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
          indexOf(__return_storage_ptr__,*(QDockAreaLayoutInfo **)((long)&pQVar1->subinfo + lVar8),
                  widget);
          if ((__return_storage_ptr__->d).size == 0) {
            bVar5 = false;
            pDVar4 = (__return_storage_ptr__->d).d;
            if (pDVar4 != (Data *)0x0) {
              LOCK();
              (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,4,0x10);
              }
            }
          }
          else {
            local_3c = (int)uVar7;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_3c);
            bVar5 = true;
          }
        }
      }
      if (bVar5) {
        if (bVar9) goto LAB_003f789a;
        break;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x28;
      uVar2 = (this->item_list).d.size;
      bVar9 = uVar7 < uVar2;
    } while (uVar7 < uVar2);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_003f789a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayoutInfo::indexOf(const QWidget *widget) const
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);

        if (item.placeHolderItem != nullptr)
            continue;

        if (item.subinfo != nullptr) {
            QList<int> result = item.subinfo->indexOf(widget);
            if (!result.isEmpty()) {
                result.prepend(i);
                return result;
            }
            continue;
        }

        if (!(item.flags & QDockAreaLayoutItem::GapItem) && item.widgetItem && item.widgetItem->widget() == widget) {
            QList<int> result;
            result << i;
            return result;
        }
    }

    return QList<int>();
}